

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * __thiscall
httplib::detail::make_content_range_header_field_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,pair<long,_long> *range,size_t content_length
          )

{
  string sStack_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"bytes ",(allocator<char> *)&sStack_38);
  if (*(long *)this != -1) {
    std::__cxx11::to_string(&sStack_38,*(long *)this);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (*(long *)(this + 8) != -1) {
    std::__cxx11::to_string(&sStack_38,*(long *)(this + 8));
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::to_string(&sStack_38,(unsigned_long)range);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

inline std::string
make_content_range_header_field(const std::pair<ssize_t, ssize_t> &range,
                                size_t content_length) {
  std::string field = "bytes ";
  if (range.first != -1) { field += std::to_string(range.first); }
  field += "-";
  if (range.second != -1) { field += std::to_string(range.second); }
  field += "/";
  field += std::to_string(content_length);
  return field;
}